

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetEndOffsetOnTable
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  IdlNamer::Type_abi_cxx11_(&local_88,&this->namer_,struct_def);
  std::operator+(&local_68,"func ",&local_88);
  std::operator+(&local_48,&local_68,"End");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::operator+=
            ((string *)local_28,"(builder *flatbuffers.Builder) flatbuffers.UOffsetT ");
  std::__cxx11::string::operator+=((string *)local_28,"{\n\treturn builder.EndObject()\n}\n");
  return;
}

Assistant:

void GetEndOffsetOnTable(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "func " + namer_.Type(struct_def) + "End";
    code += "(builder *flatbuffers.Builder) flatbuffers.UOffsetT ";
    code += "{\n\treturn builder.EndObject()\n}\n";
  }